

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BinaryOperator>::run
          (TypedDeleter<LLVMBC::BinaryOperator> *this)

{
  BinaryOperator *pBVar1;
  pointer ptr;
  
  pBVar1 = this->ptr;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(pBVar1->super_Instruction).attachments._M_h);
  ptr = (pBVar1->super_Instruction).operands.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
    return;
  }
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}